

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  Index IVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  Type ty;
  Type local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)&local_50);
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar3 = 0;
  uVar4 = 0;
  do {
    lVar2 = *(long *)this;
    if ((ulong)(*(long *)(this + 8) - lVar2 >> 3) <= uVar4) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_58 = *(Type *)(lVar2 + lVar3);
    if (local_58.enum_ == Reference) {
      IVar1 = Type::GetReferenceIndex(&local_58);
      if (IVar1 != 0xffffffff) {
        lVar2 = *(long *)this;
        goto LAB_0014e39e;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
LAB_0014e39e:
      Type::GetName_abi_cxx11_(&local_50,(Type *)(lVar2 + lVar3));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
    }
    if (uVar4 < (*(long *)(this + 8) - *(long *)this >> 3) - 1U) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    Type ty = types[i];
    // NOTE: Reference (and GetName) is also used by (e.g.) objdump, which does
    // not apply validation. do this here so as to not break that.
    if (ty == Type::Reference && ty.GetReferenceIndex() == kInvalidIndex) {
      result += "reference";
    } else {
      result += types[i].GetName();
    }
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}